

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslGrammar.cpp
# Opt level: O0

bool __thiscall
glslang::HlslGrammar::captureBlockTokens(HlslGrammar *this,TVector<glslang::HlslToken> *tokens)

{
  bool bVar1;
  EHlslTokenClass EVar2;
  int local_24;
  int braceCount;
  TVector<glslang::HlslToken> *tokens_local;
  HlslGrammar *this_local;
  
  bVar1 = HlslTokenStream::peekTokenClass(&this->super_HlslTokenStream,EHTokLeftBrace);
  if (bVar1) {
    local_24 = 0;
    do {
      EVar2 = HlslTokenStream::peek(&this->super_HlslTokenStream);
      if (EVar2 == EHTokNone) {
        return false;
      }
      if (EVar2 == EHTokLeftBrace) {
        local_24 = local_24 + 1;
      }
      else if (EVar2 == EHTokRightBrace) {
        local_24 = local_24 + -1;
      }
      std::vector<glslang::HlslToken,_glslang::pool_allocator<glslang::HlslToken>_>::push_back
                (&tokens->
                  super_vector<glslang::HlslToken,_glslang::pool_allocator<glslang::HlslToken>_>,
                 &(this->super_HlslTokenStream).token);
      HlslTokenStream::advanceToken(&this->super_HlslTokenStream);
    } while (0 < local_24);
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool HlslGrammar::captureBlockTokens(TVector<HlslToken>& tokens)
{
    if (! peekTokenClass(EHTokLeftBrace))
        return false;

    int braceCount = 0;

    do {
        switch (peek()) {
        case EHTokLeftBrace:
            ++braceCount;
            break;
        case EHTokRightBrace:
            --braceCount;
            break;
        case EHTokNone:
            // End of input before balance { } is bad...
            return false;
        default:
            break;
        }

        tokens.push_back(token);
        advanceToken();
    } while (braceCount > 0);

    return true;
}